

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::ShaderRenderCase::ShaderRenderCase
          (ShaderRenderCase *this,TestContext *testCtx,RenderContext *renderCtx,ContextInfo *ctxInfo
          ,char *name,char *description,bool isVertexCase,ShaderEvalFunc evalFunc)

{
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  ContextInfo *ctxInfo_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  ShaderRenderCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_03275908;
  this->m_renderCtx = renderCtx;
  this->m_ctxInfo = ctxInfo;
  this->m_isVertexCase = isVertexCase;
  ShaderEvaluator::ShaderEvaluator(&this->m_defaultEvaluator,evalFunc);
  this->m_evaluator = &this->m_defaultEvaluator;
  std::__cxx11::string::string((string *)&this->m_vertShaderSource);
  std::__cxx11::string::string((string *)&this->m_fragShaderSource);
  tcu::Vector<float,_4>::Vector(&this->m_clearColor,(Vector<float,_4> *)DEFAULT_CLEAR_COLOR);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms);
  std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::vector
            (&this->m_textures);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderRenderCase::ShaderRenderCase(TestContext& testCtx, RenderContext& renderCtx, const ContextInfo& ctxInfo,
								   const char* name, const char* description, bool isVertexCase,
								   ShaderEvalFunc evalFunc)
	: TestCase(testCtx, name, description)
	, m_renderCtx(renderCtx)
	, m_ctxInfo(ctxInfo)
	, m_isVertexCase(isVertexCase)
	, m_defaultEvaluator(evalFunc)
	, m_evaluator(m_defaultEvaluator)
	, m_clearColor(DEFAULT_CLEAR_COLOR)
	, m_program(DE_NULL)
{
}